

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

LocalFederateId __thiscall helics::CommonCore::getFederateId(CommonCore *this,string_view name)

{
  FederateState *pFVar1;
  FederateState *fed;
  shared_handle feds;
  shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *searchValue;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  allocator<char> local_61;
  allocator<char> *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  LocalFederateId local_4;
  
  this_00 = &local_38;
  gmlc::libguarded::
  shared_guarded<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::lock(in_stack_ffffffffffffff68);
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::operator->((shared_lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
                *)this_00);
  searchValue = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  pFVar1 = gmlc::containers::
           MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::find((MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),searchValue);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator(&local_61);
  if (pFVar1 == (FederateState *)0x0) {
    memset(&local_4,0,4);
    LocalFederateId::LocalFederateId(&local_4);
  }
  else {
    local_4.fid = (pFVar1->local_id).fid;
  }
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<gmlc::containers::MappedPointerVector<helics::FederateState,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::shared_mutex>
              *)0x490f62);
  return (LocalFederateId)local_4.fid;
}

Assistant:

LocalFederateId CommonCore::getFederateId(std::string_view name) const
{
    auto feds = federates.lock();
    auto* fed = feds->find(std::string(name));
    if (fed != nullptr) {
        return fed->local_id;
    }

    return {};
}